

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

void __thiscall Player::operator=(Player *this,Player *rhs)

{
  Player *rhs_local;
  Player *this_local;
  
  this->pOwnedCountries = rhs->pOwnedCountries;
  this->pPlayerId = rhs->pPlayerId;
  this->pDiceRoller = rhs->pDiceRoller;
  this->pCards = rhs->pCards;
  this->strategy = rhs->strategy;
  this->pObservers = rhs->pObservers;
  this->currentState = rhs->currentState;
  return;
}

Assistant:

void Player::operator=(const Player &rhs) {
    this->pOwnedCountries = rhs.pOwnedCountries;
    this->pPlayerId = rhs.pPlayerId;
    this->pDiceRoller = rhs.pDiceRoller;
    this->pCards = rhs.pCards;
    this->strategy = rhs.strategy;
    this->pObservers = rhs.pObservers;
    this->currentState = rhs.currentState;
}